

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O0

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_rc4_40>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
::finalize<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_rc4_40>,&EVP_EncryptInit_ex,&EVP_EncryptUpdate,&EVP_EncryptFinal_ex>
           *this,back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 first)

{
  int iVar1;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bVar2;
  int local_6c;
  uchar local_68 [4];
  int written;
  uint8_t buffer [64];
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_rc4_40>,_&EVP_EncryptInit_ex,_&EVP_EncryptUpdate,_&EVP_EncryptFinal_ex>
  *this_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> first_local;
  
  iVar1 = EVP_EncryptFinal_ex(*(EVP_CIPHER_CTX **)this,local_68,&local_6c);
  if (iVar1 != 1) {
    local_6c = 0;
  }
  *(long *)(this + 0x18) = (long)local_6c + *(long *)(this + 0x18);
  bVar2 = std::
          copy<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    (local_68,local_68 + local_6c,first);
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         bVar2.container;
}

Assistant:

Output finalize(Output first) {
			std::uint8_t buffer[2*EVP_MAX_BLOCK_LENGTH];

			int written;
			if (FinalFx(_context, buffer, &written) != 1)
				written = 0;

			_total_output += written;

			return std::copy(buffer, buffer + written, first);
		}